

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O2

town * town_by_name(level_map_conflict *map,char *name)

{
  long lVar1;
  int iVar2;
  char *__s2;
  town *ptVar3;
  long lVar4;
  long lVar5;
  
  if (name == (char *)0x0) {
    ptVar3 = (town *)0x0;
  }
  else {
    lVar5 = -1;
    lVar1 = -0x28;
    do {
      lVar4 = lVar1;
      lVar5 = lVar5 + 1;
      if (map->num_towns <= lVar5) {
        return (town *)0x0;
      }
      ptVar3 = map->towns;
      __s2 = level_name(map->levels + *(int *)((long)&ptVar3[1].index + lVar4));
      iVar2 = strcmp(name,__s2);
      lVar1 = lVar4 + 0x28;
    } while (iVar2 != 0);
    ptVar3 = (town *)((long)&ptVar3[1].index + lVar4);
  }
  return ptVar3;
}

Assistant:

struct town *town_by_name(struct level_map *map, const char *name)
{
	int i;

	/* No hometown */
	if (!name) return NULL;

	for (i = 0; i < map->num_towns; i++) {
		struct town *town = &map->towns[i];
		struct level *lev = &map->levels[town->index];
		if (streq(name, level_name(lev))) {
			return town;
		}
	}
	return NULL;
}